

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall Parser::Register<MulOp>(Parser *this)

{
  pointer __p;
  mapped_type *this_00;
  key_type local_40;
  unique_ptr<IOperation,_std::default_delete<IOperation>_> local_20;
  pointer local_18;
  MulOp *op;
  Parser *this_local;
  
  op = (MulOp *)this;
  __p = (pointer)operator_new(8);
  __p->_vptr_IOperation = (_func_int **)0x0;
  MulOp::MulOp((MulOp *)__p);
  local_18 = __p;
  std::unique_ptr<IOperation,std::default_delete<IOperation>>::
  unique_ptr<std::default_delete<IOperation>,void>
            ((unique_ptr<IOperation,std::default_delete<IOperation>> *)&local_20,__p);
  (**local_18->_vptr_IOperation)(&local_40);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<IOperation,_std::default_delete<IOperation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<IOperation,_std::default_delete<IOperation>_>_>_>_>
            ::operator[](&this->operations_,&local_40);
  std::unique_ptr<IOperation,_std::default_delete<IOperation>_>::operator=(this_00,&local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::unique_ptr<IOperation,_std::default_delete<IOperation>_>::~unique_ptr(&local_20);
  return;
}

Assistant:

void Register(Args &&... args) {
    auto op = new TOperation(std::forward<Args>(args)...);
    operations_[op->GetName()] = std::unique_ptr<IOperation>(op);
  }